

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O2

char * BN_bn2hex(BIGNUM *a)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  int j;
  ulong uVar6;
  char *pcVar7;
  
  uVar2 = bn_minimal_width((BIGNUM *)a);
  pcVar4 = (char *)OPENSSL_malloc((long)(int)(uVar2 << 4 | 3));
  if (pcVar4 != (char *)0x0) {
    pcVar7 = pcVar4;
    if (a->neg != 0) {
      pcVar7 = pcVar4 + 1;
      *pcVar4 = '-';
    }
    iVar3 = BN_is_zero((BIGNUM *)a);
    if (iVar3 != 0) {
      *pcVar7 = '0';
      pcVar7 = pcVar7 + 1;
    }
    uVar5 = (ulong)uVar2;
    bVar1 = false;
    while (0 < (int)uVar5) {
      uVar5 = uVar5 - 1;
      for (iVar3 = 0x38; -1 < iVar3; iVar3 = iVar3 + -8) {
        uVar6 = a->d[uVar5] >> ((byte)iVar3 & 0x3f);
        uVar2 = (uint)uVar6;
        bVar1 = bVar1 || (uVar6 & 0xff) != 0;
        if (bVar1) {
          *pcVar7 = "0123456789abcdef"[(uVar2 & 0xff) >> 4];
          pcVar7[1] = "0123456789abcdef"[uVar2 & 0xf];
          pcVar7 = pcVar7 + 2;
        }
      }
    }
    *pcVar7 = '\0';
  }
  return pcVar4;
}

Assistant:

char *BN_bn2hex(const BIGNUM *bn) {
  int width = bn_minimal_width(bn);
  char *buf = reinterpret_cast<char *>(
      OPENSSL_malloc(1 /* leading '-' */ + 1 /* zero is non-empty */ +
                     width * BN_BYTES * 2 + 1 /* trailing NUL */));
  if (buf == NULL) {
    return NULL;
  }

  char *p = buf;
  if (bn->neg) {
    *(p++) = '-';
  }

  if (BN_is_zero(bn)) {
    *(p++) = '0';
  }

  int z = 0;
  for (int i = width - 1; i >= 0; i--) {
    for (int j = BN_BITS2 - 8; j >= 0; j -= 8) {
      // strip leading zeros
      int v = ((int)(bn->d[i] >> (long)j)) & 0xff;
      if (z || v != 0) {
        *(p++) = hextable[v >> 4];
        *(p++) = hextable[v & 0x0f];
        z = 1;
      }
    }
  }
  *p = '\0';

  return buf;
}